

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphUtils.hpp
# Opt level: O1

pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
* __thiscall
floorplan::GraphUtils::makesimpleGraph_abi_cxx11_
          (pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           *__return_storage_ptr__,GraphUtils *this,floorplanGraph *G)

{
  long lVar1;
  long lVar2;
  adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
  *paVar3;
  pointer psVar4;
  pointer psVar5;
  pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *ppVar6;
  mapped_type_conflict *pmVar7;
  __normal_iterator<const_boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>_>
  _Var8;
  _List_node_base *p_Var9;
  graph_type *g_1;
  GraphUtils *pGVar10;
  GraphUtils *pGVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  pair<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>_>,_bool>
  pVar14;
  simpleGraph ret;
  graph_type *cg;
  string sourceID;
  string targetID;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  fpGraphToSimpleGraph;
  stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>
  local_100;
  back_insertion_sequence_tag local_f0;
  adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
  local_e8;
  GraphUtils *local_b0;
  key_type local_a8;
  pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *local_88;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  local_88 = __return_storage_ptr__;
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_e8,(no_property *)&local_60);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar11 = *(GraphUtils **)(this + 0x18);
  local_b0 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pGVar11 != this + 0x18) {
    do {
      lVar1 = *(long *)(pGVar11 + 0x10);
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::resize(&local_e8.super_type.m_vertices,
               ((long)local_e8.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_e8.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      psVar5 = local_e8.super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar4 = local_e8.super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_60,(key_type *)(lVar1 + 0x38));
      *pmVar7 = (int)((ulong)((long)psVar5 - (long)psVar4) >> 5) + -1;
      pGVar11 = *(GraphUtils **)pGVar11;
    } while (pGVar11 != this + 0x18);
  }
  pGVar11 = *(GraphUtils **)local_b0;
  pGVar10 = local_b0;
  if (pGVar11 != local_b0) {
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      lVar1 = *(long *)(pGVar11 + 0x18);
      lVar2 = *(long *)(*(long *)(pGVar11 + 0x10) + 0x38);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,lVar2,*(long *)(*(long *)(pGVar11 + 0x10) + 0x40) + lVar2);
      lVar2 = *(long *)(lVar1 + 0x38);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,lVar2,*(long *)(lVar1 + 0x40) + lVar2);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_60,&local_a8);
      p_Var12 = (_List_node_base *)(long)*pmVar7;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_60,&local_80);
      psVar4 = local_e8.super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var13 = (_List_node_base *)(long)*pmVar7;
      local_100.m_iter._M_node = (_List_node_base *)0x0;
      local_100.super_stored_edge<unsigned_long>.m_target = (unsigned_long)p_Var13;
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>const*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>const>>
                        (local_e8.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)p_Var12].super_StoredVertex
                         .m_out_edges.
                         super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_e8.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)p_Var12].super_StoredVertex
                         .m_out_edges.
                         super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_100);
      if (_Var8._M_current ==
          psVar4[(long)p_Var12].super_StoredVertex.m_out_edges.
          super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var9 = p_Var13;
        if (p_Var13 < p_Var12) {
          p_Var9 = p_Var12;
        }
        if ((_List_node_base *)
            ((long)local_e8.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) <= p_Var9) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(&local_e8.super_type.m_vertices,(size_type)((long)&p_Var9->_M_next + 1));
        }
        p_Var9 = (_List_node_base *)operator_new(0x28);
        p_Var9[1]._M_next = p_Var12;
        p_Var9[1]._M_prev = p_Var13;
        p_Var9[2]._M_next = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        p_Var9 = local_e8.super_type.m_edges.
                 super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        local_e8.super_type.m_edges.
        super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
        ._M_impl._M_node._M_size =
             local_e8.super_type.m_edges.
             super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
             ._M_impl._M_node._M_size + 1;
        local_100.m_iter._M_node =
             local_e8.super_type.m_edges.
             super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
        local_f0 = (back_insertion_sequence_tag)
                   &boost::detail::sp_counted_impl_pd<int*,boost::checked_array_deleter<int>>::
                    vtable;
        local_100.super_stored_edge<unsigned_long>.m_target = (unsigned_long)p_Var13;
        pVar14 = boost::graph_detail::
                 push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>>
                           ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                             *)(local_e8.super_type.m_vertices.
                                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)p_Var12),
                            &local_100,&local_f0);
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_e8.super_type.m_edges.
          super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
          ._M_impl._M_node._M_size =
               local_e8.super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
               ._M_impl._M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var9,0x28);
        }
        else {
          local_100.m_iter._M_node = p_Var9;
          local_f0 = (back_insertion_sequence_tag)
                     &boost::detail::sp_counted_impl_pd<int*,boost::checked_array_deleter<int>>::
                      vtable;
          local_100.super_stored_edge<unsigned_long>.m_target = (unsigned_long)p_Var12;
          boost::graph_detail::
          push_dispatch<std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>>>,boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::property<boost::edge_weight_t,int,boost::no_property>>>,boost::property<boost::edge_weight_t,int,boost::no_property>>>
                    ((vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                      *)(local_e8.super_type.m_vertices.
                         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)p_Var13),&local_100,
                     &local_f0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pGVar10 = local_b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pGVar11 = *(GraphUtils **)pGVar11;
    } while (pGVar11 != pGVar10);
  }
  ppVar6 = local_88;
  if (*(long *)(pGVar10 + 0x28) !=
      (long)local_e8.super_type.m_vertices.
            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_e8.super_type.m_vertices.
            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    __assert_fail("boost::num_vertices(G) == boost::num_vertices(ret)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alperv[P]libfloorplan/src/lib/GraphUtils.hpp"
                  ,0x84,
                  "static std::pair<simpleGraph, std::map<string, int>> floorplan::GraphUtils::makesimpleGraph(const floorplanGraph &)"
                 );
  }
  if (*(size_t *)(pGVar10 + 0x10) !=
      local_e8.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
      ._M_impl._M_node._M_size) {
    __assert_fail("boost::num_edges(G) == boost::num_edges(ret)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alperv[P]libfloorplan/src/lib/GraphUtils.hpp"
                  ,0x85,
                  "static std::pair<simpleGraph, std::map<string, int>> floorplan::GraphUtils::makesimpleGraph(const floorplanGraph &)"
                 );
  }
  std::
  pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::
  pair<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_&,_true>
            (local_88,&local_e8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  if (local_e8.m_property.px != (no_property *)0x0) {
    operator_delete(local_e8.m_property.px,1);
  }
  std::
  vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>::config::stored_vertex>_>
  ::~vector(&local_e8.super_type.m_vertices);
  while ((adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
          *)local_e8.super_type.m_edges.
            super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next != &local_e8) {
    paVar3 = (adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
              *)(((adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>
                   *)local_e8.super_type.m_edges.
                     super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
    operator_delete(local_e8.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0x28);
    local_e8.super_type.m_edges.
    super__List_base<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>,_std::allocator<boost::list_edge<unsigned_long,_boost::property<boost::edge_weight_t,_int,_boost::no_property>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)paVar3;
  }
  return ppVar6;
}

Assistant:

static std::pair<simpleGraph, std::map<string,int> > makesimpleGraph (const floorplanGraph& G){
        simpleGraph ret;
        map<string, int> fpGraphToSimpleGraph;
        BGL_FORALL_VERTICES(v, G, floorplanGraph){
            simpleVertex currentVertex = add_vertex(ret);
            fpGraphToSimpleGraph[G[v].vertex_id] = currentVertex;
        }
        BGL_FORALL_EDGES(e, G, floorplanGraph){
            Vertex sourceVertex = source(e, G);
            Vertex targetVertex = target(e,G);
            string sourceID =G[sourceVertex].vertex_id;
            string targetID = G[targetVertex].vertex_id;
            simpleVertex simpleSource = fpGraphToSimpleGraph[sourceID];
            simpleVertex simpleTarget = fpGraphToSimpleGraph[targetID];
            if (!edge(simpleSource,simpleTarget,ret).second)
                add_edge(simpleSource,simpleTarget, ret);
        }
        assert(boost::num_vertices(G) == boost::num_vertices(ret));
        assert(boost::num_edges(G) == boost::num_edges(ret));
        return make_pair(ret, fpGraphToSimpleGraph);
    }